

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4495f9::ECTest_ScalarBaseMultVectors_Test::TestBody
          (ECTest_ScalarBaseMultVectors_Test *this)

{
  char *in_R9;
  AssertHelper AStack_78;
  Message local_70;
  UniquePtr<BN_CTX> ctx;
  string local_60;
  AssertionResult gtest_ar_;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)BN_CTX_new();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<bignum_ctx_*,_bssl::internal::Deleter>)
       ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl !=
       (_Head_base<0UL,_bignum_ctx_*,_false>)0x0;
  if ((tuple<bignum_ctx_*,_bssl::internal::Deleter>)
      ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl ==
      (_Head_base<0UL,_bignum_ctx_*,_false>)0x0) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&gtest_ar_,(AssertionResult *)0x49a3a2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x408,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&AStack_78);
    std::__cxx11::string::~string((string *)&local_60);
    if (local_70.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_70.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    local_30._8_8_ = 0;
    local_30._M_unused._M_object = &ctx;
    local_18 = std::
               _Function_handler<void_(FileTest_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc:1035:61)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<void_(FileTest_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc:1035:61)>
               ::_M_manager;
    FileTestGTest("crypto/fipsmodule/ec/ec_scalar_base_mult_tests.txt",
                  (function<void_(FileTest_*)> *)&local_30);
    std::_Function_base::~_Function_base((_Function_base *)&local_30);
  }
  std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::~unique_ptr(&ctx);
  return;
}

Assistant:

TEST(ECTest, ScalarBaseMultVectors) {
  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  ASSERT_TRUE(ctx);

  FileTestGTest(
      "crypto/fipsmodule/ec/ec_scalar_base_mult_tests.txt", [&](FileTest *t) {
        const EC_GROUP *group = GetCurve(t, "Curve");
        ASSERT_TRUE(group);
        bssl::UniquePtr<BIGNUM> n = GetBIGNUM(t, "N");
        ASSERT_TRUE(n);
        bssl::UniquePtr<BIGNUM> x = GetBIGNUM(t, "X");
        ASSERT_TRUE(x);
        bssl::UniquePtr<BIGNUM> y = GetBIGNUM(t, "Y");
        ASSERT_TRUE(y);
        bool is_infinity = BN_is_zero(x.get()) && BN_is_zero(y.get());

        bssl::UniquePtr<BIGNUM> px(BN_new());
        ASSERT_TRUE(px);
        bssl::UniquePtr<BIGNUM> py(BN_new());
        ASSERT_TRUE(py);
        auto check_point = [&](const EC_POINT *p) {
          if (is_infinity) {
            EXPECT_TRUE(EC_POINT_is_at_infinity(group, p));
          } else {
            ASSERT_TRUE(EC_POINT_get_affine_coordinates_GFp(
                group, p, px.get(), py.get(), ctx.get()));
            EXPECT_EQ(0, BN_cmp(x.get(), px.get()));
            EXPECT_EQ(0, BN_cmp(y.get(), py.get()));
          }
        };

        const EC_POINT *g = EC_GROUP_get0_generator(group);
        bssl::UniquePtr<EC_POINT> p(EC_POINT_new(group));
        ASSERT_TRUE(p);
        // Test single-point multiplication.
        ASSERT_TRUE(
            EC_POINT_mul(group, p.get(), n.get(), nullptr, nullptr, ctx.get()));
        check_point(p.get());

        ASSERT_TRUE(
            EC_POINT_mul(group, p.get(), nullptr, g, n.get(), ctx.get()));
        check_point(p.get());
      });
}